

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_order.cpp
# Opt level: O0

void __thiscall
duckdb::PhysicalOrderGlobalSourceState::PhysicalOrderGlobalSourceState
          (PhysicalOrderGlobalSourceState *this,OrderGlobalSinkState *sink)

{
  bool bVar1;
  pointer this_00;
  pointer pSVar2;
  pointer puVar3;
  vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
  *in_RDI;
  GlobalSortState *global_sort_state;
  size_type in_stack_ffffffffffffffb8;
  GlobalSourceState *in_stack_ffffffffffffffc0;
  
  GlobalSourceState::GlobalSourceState(in_stack_ffffffffffffffc0);
  (in_RDI->
  super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
  )._M_impl.super__Vector_impl_data._M_start =
       (pointer)&PTR__PhysicalOrderGlobalSourceState_0352e7c8;
  ::std::atomic<unsigned_long>::atomic
            ((atomic<unsigned_long> *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  bVar1 = ::std::
          vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
          ::empty(in_RDI);
  if (bVar1) {
    in_RDI[3].
    super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>
    ::operator[]((vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>
                  *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    this_00 = unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>::
              operator->((unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>
                          *)in_stack_ffffffffffffffc0);
    pSVar2 = unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true>::
             operator->((unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true>
                         *)this_00);
    puVar3 = (pointer)::std::
                      vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                      ::size(&(pSVar2->data_blocks).
                              super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                            );
    in_RDI[3].
    super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = puVar3;
  }
  return;
}

Assistant:

explicit PhysicalOrderGlobalSourceState(OrderGlobalSinkState &sink) : next_batch_index(0) {
		auto &global_sort_state = sink.global_sort_state;
		if (global_sort_state.sorted_blocks.empty()) {
			total_batches = 0;
		} else {
			D_ASSERT(global_sort_state.sorted_blocks.size() == 1);
			total_batches = global_sort_state.sorted_blocks[0]->payload_data->data_blocks.size();
		}
	}